

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMap.c
# Opt level: O1

void Mpm_ManPerform(Mpm_Man_t *p)

{
  Mig_Man_t *pMVar1;
  int *piVar2;
  int *piVar3;
  long lVar4;
  
  if (p->pPars->fMap4Cnf == 0) {
    p->pCutCmp = Mpm_CutCompareDelay;
    Mpm_ManPerformRound(p);
    if (p->pPars->fOneRound != 0) {
      return;
    }
    p->pCutCmp = Mpm_CutCompareDelay2;
    Mpm_ManPerformRound(p);
    p->pCutCmp = Mpm_CutCompareArea;
    Mpm_ManPerformRound(p);
    p->fMainRun = 1;
    p->pCutCmp = Mpm_CutCompareArea;
    pMVar1 = p->pMig;
    if (0 < pMVar1->nObjs) {
      piVar2 = (p->vMapRefs).pArray;
      piVar3 = (p->vEstRefs).pArray;
      lVar4 = 0;
      do {
        piVar3[lVar4] = (piVar2[lVar4] * 100 + piVar3[lVar4]) / 2;
        lVar4 = lVar4 + 1;
      } while (lVar4 < pMVar1->nObjs);
    }
    Mpm_ManPerformRound(p);
    p->pCutCmp = Mpm_CutCompareArea2;
    if (p->fMainRun == 0) {
      __assert_fail("p->fMainRun",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMap.c"
                    ,0x2db,"void Mpm_ManComputeEstRefs(Mpm_Man_t *)");
    }
    pMVar1 = p->pMig;
    if (0 < pMVar1->nObjs) {
      piVar2 = (p->vMapRefs).pArray;
      piVar3 = (p->vEstRefs).pArray;
      lVar4 = 0;
      do {
        piVar3[lVar4] = (piVar2[lVar4] * 100 + piVar3[lVar4]) / 2;
        lVar4 = lVar4 + 1;
      } while (lVar4 < pMVar1->nObjs);
    }
  }
  else {
    p->pCutCmp = Mpm_CutCompareArea;
  }
  Mpm_ManPerformRound(p);
  return;
}

Assistant:

void Mpm_ManPerform( Mpm_Man_t * p )
{
    if ( p->pPars->fMap4Cnf )
    {
        p->pCutCmp = Mpm_CutCompareArea;
        Mpm_ManPerformRound( p );   
    }
    else
    {
        p->pCutCmp = Mpm_CutCompareDelay;
        Mpm_ManPerformRound( p );
        if ( p->pPars->fOneRound )
            return;
    
        p->pCutCmp = Mpm_CutCompareDelay2;
        Mpm_ManPerformRound( p );
    
        p->pCutCmp = Mpm_CutCompareArea;
        Mpm_ManPerformRound( p );   

        p->fMainRun = 1;

        p->pCutCmp = Mpm_CutCompareArea;
        Mpm_ManComputeEstRefs( p );
        Mpm_ManPerformRound( p );

        p->pCutCmp = Mpm_CutCompareArea2;
        Mpm_ManComputeEstRefs( p );
        Mpm_ManPerformRound( p );
    }
}